

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O3

void __thiscall
wasm::ParamUtils::localizeCallsTo(std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::
equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>const&,wasm::Module&,wasm::PassRunner*)::
LocalizerPass::handleCall(wasm::Expression*,wasm::HeapType_
          (void *this,Expression *call,HeapType type)

{
  long lVar1;
  undefined8 uVar2;
  const_iterator cVar3;
  Expression *pEVar4;
  const_iterator cVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  uintptr_t *puVar8;
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  undefined1 local_70 [8];
  ChildLocalizer localizer;
  HeapType type_local;
  Expression *local_30;
  
  localizer._40_8_ = type.id;
  cVar3 = std::
          _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(*(_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   **)((long)this + 0x130),(key_type *)&localizer.hasUnreachableChild);
  if (cVar3.super__Node_iterator_base<wasm::HeapType,_true>._M_cur != (__node_type *)0x0) {
    ChildLocalizer::ChildLocalizer
              ((ChildLocalizer *)local_70,call,*(Function **)((long)this + 0x120),
               *(Module **)((long)this + 0x128),(PassOptions *)(*(long *)((long)this + 8) + 0x30));
    pEVar4 = ChildLocalizer::getReplacement((ChildLocalizer *)local_70);
    if (pEVar4 != call) {
      puVar8 = *(uintptr_t **)((long)this + 0x58);
      lVar1 = *(long *)((long)this + 0x120);
      if (lVar1 != 0) {
        type_local.id = *puVar8;
        local_30 = pEVar4;
        if (*(long *)(lVar1 + 0xf0) != 0) {
          this_00 = (_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)(lVar1 + 0xd8);
          cVar5 = std::
                  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(this_00,&local_30);
          if (cVar5.
              super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            iVar6 = std::
                    _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(this_00,(key_type *)&type_local);
            if (iVar6.
                super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                ._M_cur != (__node_type *)0x0) {
              pmVar7 = std::__detail::
                       _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)this_00,&local_30);
              *(undefined8 *)
               ((long)&(pmVar7->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                       _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                       _M_payload._M_value.symbolNameIndex.
                       super__Optional_base<unsigned_int,_true,_true>._M_payload + 4) =
                   *(undefined8 *)
                    ((long)iVar6.
                           super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                           ._M_cur + 0x20);
              uVar2 = *(undefined8 *)
                       ((long)iVar6.
                              super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                              ._M_cur + 0x18);
              *(undefined8 *)
               &(pmVar7->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload
                .super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
                   *(undefined8 *)
                    ((long)iVar6.
                           super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                           ._M_cur + 0x10);
              *(undefined8 *)
               ((long)&(pmVar7->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                       _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                       _M_payload + 8) = uVar2;
            }
          }
        }
        puVar8 = *(uintptr_t **)((long)this + 0x58);
      }
      *puVar8 = (uintptr_t)pEVar4;
      *(undefined1 *)((long)this + 0x138) = 1;
    }
    if (localizer.wasm != (Module *)0x0) {
      operator_delete(localizer.wasm,
                      (long)localizer.sets.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)localizer.wasm);
    }
  }
  return;
}

Assistant:

void handleCall(Expression* call, HeapType type) {
      if (!callTargets.count(type)) {
        return;
      }

      ChildLocalizer localizer(
        call, getFunction(), *getModule(), getPassOptions());
      auto* replacement = localizer.getReplacement();
      if (replacement != call) {
        replaceCurrent(replacement);
        optimized = true;
      }
    }